

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall ccs::CcsDomain::logRuleDag(CcsDomain *this,ostream *os)

{
  element_type *node;
  DagBuilder local_38;
  ostream *os_local;
  CcsDomain *this_local;
  
  local_38.buildContext_.super___shared_ptr<ccs::BuildContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)os;
  os_local = (ostream *)this;
  std::unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>::operator->(&this->dag);
  DagBuilder::root(&local_38);
  node = std::__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )&local_38);
  Dumper::Dumper((Dumper *)
                 &local_38.root_.super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,node);
  ccs::operator<<(os,(Dumper *)
                     &local_38.root_.super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  Dumper::~Dumper((Dumper *)
                  &local_38.root_.super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
  std::shared_ptr<const_ccs::Node>::~shared_ptr((shared_ptr<const_ccs::Node> *)&local_38);
  return;
}

Assistant:

void CcsDomain::logRuleDag(std::ostream &os) const {
  os << Dumper(*dag->root());
}